

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_mcrfs(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i32 pTVar4;
  int shift;
  int nibble;
  int bfa;
  TCGv_i64 tnew_fpscr;
  TCGv_i32 tmask;
  TCGv_i64 tmp;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx_00);
  ret_00 = tcg_temp_new_i64(tcg_ctx_00);
  if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
    uVar1 = crfS(ctx->opcode);
    iVar2 = (7 - uVar1) * 4;
    tcg_gen_shri_i64_ppc64(tcg_ctx_00,ret,cpu_fpscr,(long)iVar2);
    uVar3 = crfD(ctx->opcode);
    tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,cpu_crf[uVar3],ret);
    uVar3 = crfD(ctx->opcode);
    pTVar4 = cpu_crf[uVar3];
    uVar3 = crfD(ctx->opcode);
    tcg_gen_andi_i32_ppc64(tcg_ctx_00,pTVar4,cpu_crf[uVar3],0xf);
    tcg_temp_free_i64(tcg_ctx_00,ret);
    tcg_gen_mov_i64_ppc64(tcg_ctx_00,ret_00,cpu_fpscr);
    tcg_gen_andi_i64_ppc64
              (tcg_ctx_00,ret_00,ret_00,
               (long)(0xf << ((byte)iVar2 & 0x1f)) & 0x9ff80700U ^ 0xffffffffffffffff);
    pTVar4 = tcg_const_i32_ppc64(tcg_ctx_00,1 << ((byte)(7 - uVar1) & 0x1f));
    gen_helper_store_fpscr(tcg_ctx_00,tcg_ctx_00->cpu_env,ret_00,pTVar4);
    tcg_temp_free_i32(tcg_ctx_00,pTVar4);
    tcg_temp_free_i64(tcg_ctx_00,ret_00);
  }
  else {
    gen_exception(ctx,7);
  }
  return;
}

Assistant:

static void gen_mcrfs(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv tmp = tcg_temp_new(tcg_ctx);
    TCGv_i32 tmask;
    TCGv_i64 tnew_fpscr = tcg_temp_new_i64(tcg_ctx);
    int bfa;
    int nibble;
    int shift;

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    bfa = crfS(ctx->opcode);
    nibble = 7 - bfa;
    shift = 4 * nibble;
    tcg_gen_shri_tl(tcg_ctx, tmp, cpu_fpscr, shift);
    tcg_gen_trunc_tl_i32(tcg_ctx, cpu_crf[crfD(ctx->opcode)], tmp);
    tcg_gen_andi_i32(tcg_ctx, cpu_crf[crfD(ctx->opcode)], cpu_crf[crfD(ctx->opcode)],
                     0xf);
    tcg_temp_free(tcg_ctx, tmp);
    tcg_gen_extu_tl_i64(tcg_ctx, tnew_fpscr, cpu_fpscr);
    /* Only the exception bits (including FX) should be cleared if read */
    tcg_gen_andi_i64(tcg_ctx, tnew_fpscr, tnew_fpscr,
                     ~((0xF << shift) & FP_EX_CLEAR_BITS));
    /* FEX and VX need to be updated, so don't set fpscr directly */
    tmask = tcg_const_i32(tcg_ctx, 1 << nibble);
    gen_helper_store_fpscr(tcg_ctx, tcg_ctx->cpu_env, tnew_fpscr, tmask);
    tcg_temp_free_i32(tcg_ctx, tmask);
    tcg_temp_free_i64(tcg_ctx, tnew_fpscr);
}